

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::SwitchStmt::clear(SwitchStmt *this)

{
  bool bVar1;
  element_type *peVar2;
  reference ppVar3;
  element_type *peVar4;
  pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *iter;
  iterator __end1;
  iterator __begin1;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range1;
  SwitchStmt *this_local;
  
  peVar2 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->target_stmt_);
  (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  __end1 = std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::begin(&this->body_);
  iter = (pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *)
         std::
         map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
         ::end(&this->body_);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
             ::operator*(&__end1);
    peVar4 = std::
             __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&ppVar3->second);
    (*(peVar4->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
    std::
    _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SwitchStmt::clear() {
    target_stmt_->clear();
    for (auto const &iter : body_) {
        iter.second->clear();
    }
}